

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_diag.c
# Opt level: O2

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f)

{
  int iVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined8 *)f->local_context;
  for (iVar3 = 0; iVar3 < *(int *)(puVar2 + 2); iVar3 = iVar3 + 1) {
    for (iVar4 = 0; iVar1 = *(int *)((long)puVar2 + 0x2c), iVar4 < iVar1; iVar4 = iVar4 + 1) {
      if (iVar4 == iVar3 % iVar1) {
        uVar6 = (*(code *)puVar2[1])(*puVar2,iVar3);
        uVar5 = puVar2[3];
        iVar1 = *(int *)((long)puVar2 + 0x2c);
      }
      else {
        uVar5 = puVar2[3];
        uVar6 = 0;
      }
      (*(code *)puVar2[4])(uVar6,uVar5,iVar1 * iVar3 + iVar4);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_matrix_diag_generic(rt_function_t *f) {
  matrix_diag_local_context_t *context =
      (matrix_diag_local_context_t *)(f->local_context);

  int i, j;
  for (i = 0; i < context->input_size; i++) {
    for (j = 0; j < context->last_ndim; j++) {
      if (i % context->last_ndim == j) {
        float x = context->get_input(context->input, i);
        context->set_output(context->output, i * context->last_ndim + j, x);
      } else {
        context->set_output(context->output, i * context->last_ndim + j, 0.);
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}